

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

string * __thiscall pbrt::XYZ::ToString_abi_cxx11_(string *__return_storage_ptr__,XYZ *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,float_const&,float_const&>
            (__return_storage_ptr__,"[ %f %f %f ]",&this->X,&this->Y,&this->Z);
  return __return_storage_ptr__;
}

Assistant:

std::string XYZ::ToString() const {
    return StringPrintf("[ %f %f %f ]", X, Y, Z);
}